

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack4_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  int k;
  float *k33;
  float *k32;
  float *k31;
  float *k30;
  float *k23;
  float *k22;
  float *k21;
  float *k20;
  float *k13;
  float *k12;
  float *k11;
  float *k10;
  float *k03;
  float *k02;
  float *k01;
  float *k00;
  int p;
  float *g00;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff750;
  size_t in_stack_fffffffffffff758;
  undefined8 in_stack_fffffffffffff760;
  int _c;
  undefined8 in_stack_fffffffffffff768;
  Mat *in_stack_fffffffffffff770;
  Allocator *in_stack_fffffffffffff830;
  undefined8 in_stack_fffffffffffff838;
  undefined8 in_stack_fffffffffffff840;
  Mat *in_stack_fffffffffffff848;
  int local_784;
  int local_6fc;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined4 local_6e0;
  long local_6d8;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined8 local_6b8;
  undefined4 *local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined4 local_680;
  undefined4 local_674;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined4 local_638;
  undefined4 local_62c;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined4 local_5f0;
  undefined4 local_5e4;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined4 local_5b8;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined8 local_590;
  int local_588;
  void *local_578;
  int *local_570;
  long local_568;
  long *local_558;
  int local_54c;
  int local_548;
  long local_538;
  int local_52c;
  int local_520;
  int local_51c;
  long *local_518;
  undefined8 *local_508;
  undefined8 *local_4f8;
  undefined8 *local_4e8;
  undefined8 *local_4d8;
  undefined8 *local_4c8;
  void **local_4b8;
  int local_498;
  undefined4 local_494;
  void **local_490;
  undefined8 *local_470;
  undefined8 *local_450;
  undefined8 *local_430;
  undefined8 *local_410;
  undefined8 *local_3f0;
  undefined1 local_3e5;
  int local_3e4;
  undefined8 *local_3d8;
  undefined1 local_3b5;
  int local_3b4;
  void **local_3b0;
  undefined8 *local_3a8;
  undefined1 local_385;
  int local_384;
  void **local_380;
  undefined8 *local_378;
  undefined1 local_355;
  int local_354;
  void **local_350;
  undefined8 *local_348;
  undefined1 local_325;
  int local_324;
  void **local_320;
  undefined8 *local_318;
  undefined8 *local_2f8;
  int local_2ec;
  undefined8 *local_2e8;
  int local_2dc;
  undefined8 *local_2d8;
  int local_2cc;
  undefined8 *local_2c8;
  int local_2bc;
  undefined8 *local_2b8;
  int local_2ac;
  undefined8 *local_2a8;
  int local_29c;
  undefined8 *local_298;
  int local_28c;
  undefined8 *local_288;
  int local_27c;
  undefined8 *local_278;
  int local_26c;
  undefined8 *local_268;
  int local_25c;
  undefined8 *local_258;
  int local_24c;
  undefined8 *local_248;
  int local_23c;
  undefined8 *local_238;
  int local_22c;
  undefined8 *local_228;
  int local_21c;
  undefined8 *local_218;
  int local_20c;
  undefined8 *local_208;
  int local_1fc;
  undefined8 *local_1f8;
  void *local_150;
  undefined8 *local_138;
  void *local_118;
  undefined8 *local_100;
  void *local_e0;
  undefined8 *local_c8;
  void *local_a8;
  undefined8 *local_90;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff760 >> 0x20);
  local_52c = in_R8D * in_R9D;
  local_520 = in_ECX;
  local_51c = in_EDX;
  local_518 = in_RSI;
  Mat::reshape(in_stack_fffffffffffff848,(int)((ulong)in_stack_fffffffffffff840 >> 0x20),
               (int)in_stack_fffffffffffff840,(int)((ulong)in_stack_fffffffffffff838 >> 0x20),
               in_stack_fffffffffffff830);
  Mat::create(in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20),
              (int)in_stack_fffffffffffff768,_c,in_stack_fffffffffffff758,in_stack_fffffffffffff750)
  ;
  for (local_588 = 0; local_588 + 3 < local_520; local_588 = local_588 + 4) {
    local_318 = &local_5d0;
    local_320 = &local_578;
    local_150 = (void *)((long)local_578 + local_538 * local_588 * local_568);
    local_138 = &local_5d0;
    local_8 = (long)local_54c * (long)local_548 * local_568;
    local_354 = local_588 + 1;
    local_348 = &local_618;
    local_350 = &local_578;
    local_118 = (void *)((long)local_578 + local_538 * local_354 * local_568);
    local_100 = &local_618;
    local_18 = (long)local_54c * (long)local_548 * local_568;
    local_384 = local_588 + 2;
    local_378 = &local_660;
    local_380 = &local_578;
    local_e0 = (void *)((long)local_578 + local_538 * local_384 * local_568);
    local_c8 = &local_660;
    local_28 = (long)local_54c * (long)local_548 * local_568;
    local_3b4 = local_588 + 3;
    local_3a8 = &local_6a8;
    local_3b0 = &local_578;
    local_a8 = (void *)((long)local_578 + local_538 * local_3b4 * local_568);
    local_90 = &local_6a8;
    local_38 = (long)local_54c * (long)local_548 * local_568;
    local_3e4 = local_588 / 4;
    local_3d8 = &local_6f8;
    local_5c = *(int *)((long)local_518 + 0x2c);
    local_60 = (int)local_518[6];
    local_64 = *(undefined4 *)((long)local_518 + 0x34);
    local_70 = (undefined4 *)(*local_518 + local_518[8] * (long)local_3e4 * local_518[2]);
    local_78 = local_518[2];
    local_7c = (undefined4)local_518[3];
    local_88 = local_518[4];
    local_58 = &local_6f8;
    local_48 = (long)local_5c * (long)local_60 * local_78;
    local_2f8 = &local_6f8;
    local_508 = &local_6f8;
    local_6b0 = local_70;
    for (local_6fc = 0; local_6fc + 3 < local_51c; local_6fc = local_6fc + 4) {
      local_1f8 = &local_5d0;
      local_1fc = local_6fc;
      local_20c = local_6fc + 1;
      local_208 = &local_5d0;
      local_21c = local_6fc + 2;
      local_218 = &local_5d0;
      local_22c = local_6fc + 3;
      local_228 = &local_5d0;
      local_238 = &local_618;
      local_23c = local_6fc;
      local_24c = local_6fc + 1;
      local_248 = &local_618;
      local_25c = local_6fc + 2;
      local_258 = &local_618;
      local_26c = local_6fc + 3;
      local_268 = &local_618;
      local_278 = &local_660;
      local_27c = local_6fc;
      local_28c = local_6fc + 1;
      local_288 = &local_660;
      local_29c = local_6fc + 2;
      local_298 = &local_660;
      local_2ac = local_6fc + 3;
      local_2a8 = &local_660;
      local_2b8 = &local_6a8;
      local_2bc = local_6fc;
      local_2cc = local_6fc + 1;
      local_2c8 = &local_6a8;
      local_2dc = local_6fc + 2;
      local_2d8 = &local_6a8;
      local_2ec = local_6fc + 3;
      local_2e8 = &local_6a8;
      for (local_784 = 0; local_784 < local_52c; local_784 = local_784 + 1) {
        *local_6b0 = *(undefined4 *)
                      ((long)local_150 +
                      (long)local_784 * 4 + (long)local_54c * (long)local_6fc * local_568);
        local_6b0[1] = *(undefined4 *)
                        ((long)local_118 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_6fc * local_568);
        local_6b0[2] = *(undefined4 *)
                        ((long)local_e0 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_6fc * local_568);
        local_6b0[3] = *(undefined4 *)
                        ((long)local_a8 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_6fc * local_568);
        local_6b0[4] = *(undefined4 *)
                        ((long)local_150 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_20c * local_568);
        local_6b0[5] = *(undefined4 *)
                        ((long)local_118 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_24c * local_568);
        local_6b0[6] = *(undefined4 *)
                        ((long)local_e0 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_28c * local_568);
        local_6b0[7] = *(undefined4 *)
                        ((long)local_a8 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_2cc * local_568);
        local_6b0[8] = *(undefined4 *)
                        ((long)local_150 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_21c * local_568);
        local_6b0[9] = *(undefined4 *)
                        ((long)local_118 +
                        (long)local_784 * 4 + (long)local_54c * (long)local_25c * local_568);
        local_6b0[10] =
             *(undefined4 *)
              ((long)local_e0 + (long)local_784 * 4 + (long)local_54c * (long)local_29c * local_568)
        ;
        local_6b0[0xb] =
             *(undefined4 *)
              ((long)local_a8 + (long)local_784 * 4 + (long)local_54c * (long)local_2dc * local_568)
        ;
        local_6b0[0xc] =
             *(undefined4 *)
              ((long)local_150 + (long)local_784 * 4 + (long)local_54c * (long)local_22c * local_568
              );
        local_6b0[0xd] =
             *(undefined4 *)
              ((long)local_118 + (long)local_784 * 4 + (long)local_54c * (long)local_26c * local_568
              );
        local_6b0[0xe] =
             *(undefined4 *)
              ((long)local_e0 + (long)local_784 * 4 + (long)local_54c * (long)local_2ac * local_568)
        ;
        local_6b0[0xf] =
             *(undefined4 *)
              ((long)local_a8 + (long)local_784 * 4 + (long)local_54c * (long)local_2ec * local_568)
        ;
        local_6b0 = local_6b0 + 0x10;
      }
    }
    local_4f8 = &local_6a8;
    local_4e8 = &local_660;
    local_4d8 = &local_618;
    local_62c = 0;
    local_658 = 0;
    local_660 = 0;
    local_674 = 0;
    local_6a0 = 0;
    local_6a8 = 0;
    local_6c0 = 0;
    local_6c4 = 0;
    local_6c8 = 0;
    local_6cc = 0;
    local_6e0 = 0;
    local_6e8 = 0;
    local_6f0 = 0;
    local_6f8 = 0;
    local_c = 0x10;
    local_1c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_4c = 0x10;
    local_324 = local_588;
    local_325 = 1;
    local_355 = 1;
    local_385 = 1;
    local_3b5 = 1;
    local_3e5 = 1;
    local_620 = 0;
    local_638 = 0;
    local_668 = 0;
    local_680 = 0;
    local_6b8 = 0;
    local_6d0 = 0;
    local_618 = 0;
    local_5f0 = 0;
    local_5e4 = 0;
    local_5d8 = 0;
    local_610 = 0;
    local_4c8 = &local_5d0;
    local_5d0 = 0;
    local_5c0 = 0;
    local_5b8 = 0;
    local_5a8 = 0;
    local_5a4 = 0;
    local_5a0 = 0;
    local_59c = 0;
    local_598 = 0;
    local_590 = 0;
    local_5c8 = 0;
    local_470 = local_4c8;
    local_450 = local_4d8;
    local_430 = local_4e8;
    local_410 = local_4f8;
    local_3f0 = local_508;
    local_6d8 = local_88;
  }
  local_4b8 = &local_578;
  if (local_570 != (int *)0x0) {
    local_494 = 0xffffffff;
    LOCK();
    local_498 = *local_570;
    *local_570 = *local_570 + -1;
    UNLOCK();
    if (local_498 == 1) {
      local_490 = local_4b8;
      if (local_558 == (long *)0x0) {
        if (local_578 != (void *)0x0) {
          free(local_578);
        }
      }
      else {
        (**(code **)(*local_558 + 0x18))(local_558,local_578);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack4_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4b-4a-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * maxk, inch / 4, outch / 4);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00[4] = k01[k];
                g00[5] = k11[k];
                g00[6] = k21[k];
                g00[7] = k31[k];

                g00[8] = k02[k];
                g00[9] = k12[k];
                g00[10] = k22[k];
                g00[11] = k32[k];

                g00[12] = k03[k];
                g00[13] = k13[k];
                g00[14] = k23[k];
                g00[15] = k33[k];

                g00 += 16;
            }
        }
    }
}